

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall MovingAverage::MovingAverage(MovingAverage *this,int sz)

{
  int sz_local;
  MovingAverage *this_local;
  
  std::vector<double,_std::allocator<double>_>::vector(&this->v);
  this->size = sz;
  std::vector<double,_std::allocator<double>_>::resize(&this->v,(long)this->size);
  this->pos = 0;
  this->crossed = false;
  return;
}

Assistant:

explicit MovingAverage(int sz)
    {
        size = sz;
        v.resize(size);
        pos = 0;
        crossed = false;
    }